

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplerParameterIError.cpp
# Opt level: O1

void __thiscall
glcts::TextureBorderClampSamplerParameterIErrorTest::initTest
          (TextureBorderClampSamplerParameterIErrorTest *this)

{
  vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
  *this_00;
  pointer *ppPVar1;
  iterator iVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  PnameParams local_2c;
  long lVar5;
  
  if ((this->super_TextureBorderClampBase).super_TestCaseBase.m_is_texture_border_clamp_supported !=
      false) {
    iVar3 = (*((this->super_TextureBorderClampBase).super_TestCaseBase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar3);
    (**(code **)(lVar5 + 0x6f0))(1,&this->m_sampler_id);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Error generating sampler object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplerParameterIError.cpp"
                    ,0x5f);
    (**(code **)(lVar5 + 0xa8))(0,this->m_sampler_id);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Error binding sampler object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplerParameterIError.cpp"
                    ,99);
    this_00 = &this->m_pnames_list;
    local_2c.pname = 0x2800;
    local_2c.params[0] = 0x2601;
    local_2c.params[1] = 0;
    local_2c.params[2] = 0;
    local_2c.params[3] = 0;
    iVar2._M_current =
         (this->m_pnames_list).
         super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_pnames_list).
        super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
      ::_M_realloc_insert<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>
                (this_00,iVar2,&local_2c);
    }
    else {
      (iVar2._M_current)->params[3] = 0;
      (iVar2._M_current)->pname = 0x2800;
      (iVar2._M_current)->params[0] = 0x2601;
      (iVar2._M_current)->params[1] = 0;
      (iVar2._M_current)->params[2] = 0;
      ppPVar1 = &(this->m_pnames_list).
                 super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    local_2c.pname = 0x2801;
    local_2c.params[0] = 0x2702;
    local_2c.params[1] = 0;
    local_2c.params[2] = 0;
    local_2c.params[3] = 0;
    iVar2._M_current =
         (this->m_pnames_list).
         super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_pnames_list).
        super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
      ::_M_realloc_insert<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>
                (this_00,iVar2,&local_2c);
    }
    else {
      (iVar2._M_current)->params[3] = 0;
      (iVar2._M_current)->pname = 0x2801;
      (iVar2._M_current)->params[0] = 0x2702;
      (iVar2._M_current)->params[1] = 0;
      (iVar2._M_current)->params[2] = 0;
      ppPVar1 = &(this->m_pnames_list).
                 super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    local_2c.pname = 0x813a;
    local_2c.params[0] = 1;
    local_2c.params[1] = 0;
    local_2c.params[2] = 0;
    local_2c.params[3] = 0;
    iVar2._M_current =
         (this->m_pnames_list).
         super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_pnames_list).
        super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
      ::_M_realloc_insert<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>
                (this_00,iVar2,&local_2c);
    }
    else {
      (iVar2._M_current)->params[3] = 0;
      (iVar2._M_current)->pname = 0x813a;
      (iVar2._M_current)->params[0] = 1;
      (iVar2._M_current)->params[1] = 0;
      (iVar2._M_current)->params[2] = 0;
      ppPVar1 = &(this->m_pnames_list).
                 super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    local_2c.pname = 0x813b;
    local_2c.params[0] = 1;
    local_2c.params[1] = 0;
    local_2c.params[2] = 0;
    local_2c.params[3] = 0;
    iVar2._M_current =
         (this->m_pnames_list).
         super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_pnames_list).
        super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
      ::_M_realloc_insert<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>
                (this_00,iVar2,&local_2c);
    }
    else {
      (iVar2._M_current)->params[3] = 0;
      (iVar2._M_current)->pname = 0x813b;
      (iVar2._M_current)->params[0] = 1;
      (iVar2._M_current)->params[1] = 0;
      (iVar2._M_current)->params[2] = 0;
      ppPVar1 = &(this->m_pnames_list).
                 super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    local_2c.pname = 0x2802;
    local_2c.params[0] = 0x2901;
    local_2c.params[1] = 0;
    local_2c.params[2] = 0;
    local_2c.params[3] = 0;
    iVar2._M_current =
         (this->m_pnames_list).
         super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_pnames_list).
        super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
      ::_M_realloc_insert<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>
                (this_00,iVar2,&local_2c);
    }
    else {
      (iVar2._M_current)->params[3] = 0;
      (iVar2._M_current)->pname = 0x2802;
      (iVar2._M_current)->params[0] = 0x2901;
      (iVar2._M_current)->params[1] = 0;
      (iVar2._M_current)->params[2] = 0;
      ppPVar1 = &(this->m_pnames_list).
                 super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    local_2c.pname = 0x2803;
    local_2c.params[0] = 0x2901;
    local_2c.params[1] = 0;
    local_2c.params[2] = 0;
    local_2c.params[3] = 0;
    iVar2._M_current =
         (this->m_pnames_list).
         super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_pnames_list).
        super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
      ::_M_realloc_insert<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>
                (this_00,iVar2,&local_2c);
    }
    else {
      (iVar2._M_current)->params[3] = 0;
      (iVar2._M_current)->pname = 0x2803;
      (iVar2._M_current)->params[0] = 0x2901;
      (iVar2._M_current)->params[1] = 0;
      (iVar2._M_current)->params[2] = 0;
      ppPVar1 = &(this->m_pnames_list).
                 super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    local_2c.pname = 0x8072;
    local_2c.params[0] = 0x2901;
    local_2c.params[1] = 0;
    local_2c.params[2] = 0;
    local_2c.params[3] = 0;
    iVar2._M_current =
         (this->m_pnames_list).
         super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_pnames_list).
        super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
      ::_M_realloc_insert<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>
                (this_00,iVar2,&local_2c);
    }
    else {
      (iVar2._M_current)->params[3] = 0;
      (iVar2._M_current)->pname = 0x8072;
      (iVar2._M_current)->params[0] = 0x2901;
      (iVar2._M_current)->params[1] = 0;
      (iVar2._M_current)->params[2] = 0;
      ppPVar1 = &(this->m_pnames_list).
                 super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    local_2c.pname =
         (this->super_TextureBorderClampBase).super_TestCaseBase.m_glExtTokens.TEXTURE_BORDER_COLOR;
    local_2c.params[0] = 0;
    local_2c.params[1] = 0;
    local_2c.params[2] = 0;
    local_2c.params[3] = 0;
    iVar2._M_current =
         (this->m_pnames_list).
         super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_pnames_list).
        super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
      ::_M_realloc_insert<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>
                (this_00,iVar2,&local_2c);
    }
    else {
      (iVar2._M_current)->params[3] = 0;
      (iVar2._M_current)->pname = (int)(ulong)local_2c.pname;
      (iVar2._M_current)->params[0] = (int)((ulong)local_2c.pname >> 0x20);
      (iVar2._M_current)->params[1] = 0;
      (iVar2._M_current)->params[2] = 0;
      ppPVar1 = &(this->m_pnames_list).
                 super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    local_2c.pname = 0x884c;
    local_2c.params[0] = 0;
    local_2c.params[1] = 0;
    local_2c.params[2] = 0;
    local_2c.params[3] = 0;
    iVar2._M_current =
         (this->m_pnames_list).
         super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_pnames_list).
        super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
      ::_M_realloc_insert<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>
                (this_00,iVar2,&local_2c);
    }
    else {
      (iVar2._M_current)->params[3] = 0;
      (iVar2._M_current)->pname = 0x884c;
      (iVar2._M_current)->params[0] = 0;
      (iVar2._M_current)->params[1] = 0;
      (iVar2._M_current)->params[2] = 0;
      ppPVar1 = &(this->m_pnames_list).
                 super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    local_2c.pname = 0x884d;
    local_2c.params[0] = 0x203;
    local_2c.params[1] = 0;
    local_2c.params[2] = 0;
    local_2c.params[3] = 0;
    iVar2._M_current =
         (this->m_pnames_list).
         super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_pnames_list).
        super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
      ::_M_realloc_insert<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>
                (this_00,iVar2,&local_2c);
    }
    else {
      (iVar2._M_current)->params[3] = 0;
      (iVar2._M_current)->pname = 0x884d;
      (iVar2._M_current)->params[0] = 0x203;
      (iVar2._M_current)->params[1] = 0;
      (iVar2._M_current)->params[2] = 0;
      ppPVar1 = &(this->m_pnames_list).
                 super__Vector_base<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Texture border clamp functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplerParameterIError.cpp"
             ,0x57);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBorderClampSamplerParameterIErrorTest::initTest(void)
{
	if (!m_is_texture_border_clamp_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BORDER_CLAMP_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate a sampler object */
	gl.genSamplers(1, &m_sampler_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating sampler object");

	/* Bind the sampler object to a texture unit */
	gl.bindSampler(m_texture_unit_index, m_sampler_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding sampler object");

	/* Fill list with property name + property value pairs that should
	 * be used to verify that glGetSamplerParameterI*() and glSamplerParameterI*()
	 * entry-points generate errors for non-generated sampler objects
	 * as per extension specification.
	 */
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_MAG_FILTER, GL_LINEAR));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_LINEAR));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_MIN_LOD, 1));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_MAX_LOD, 1));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_WRAP_S, GL_REPEAT));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_WRAP_T, GL_REPEAT));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_WRAP_R, GL_REPEAT));
	m_pnames_list.push_back(PnameParams(m_glExtTokens.TEXTURE_BORDER_COLOR, 0, 0, 0, 0));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_COMPARE_MODE, GL_NONE));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_COMPARE_FUNC, GL_LEQUAL));
}